

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::deallocateBuckets(SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                    *this)

{
  DenseSetPair<unsigned_short> *Ptr;
  LargeRep *pLVar1;
  SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
  *this_local;
  
  if (((undefined1  [24])*this & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
    pLVar1 = getLargeRep(this);
    Ptr = pLVar1->Buckets;
    pLVar1 = getLargeRep(this);
    deallocate_buffer(Ptr,(ulong)pLVar1->NumBuckets << 1,2);
    getLargeRep(this);
  }
  return;
}

Assistant:

void deallocateBuckets() {
    if (Small)
      return;

    deallocate_buffer(getLargeRep()->Buckets,
                      sizeof(BucketT) * getLargeRep()->NumBuckets,
                      alignof(BucketT));
    getLargeRep()->~LargeRep();
  }